

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

void __thiscall GF2::VFunc<7UL,_8UL>::VFunc(VFunc<7UL,_8UL> *this,word valRight)

{
  WW<8UL> local_8;
  
  local_8._words[0] = (word  [1])(valRight & 0xff);
  Func<7UL,_GF2::WW<8UL>_>::Func(&this->super_Func<7UL,_GF2::WW<8UL>_>,&local_8);
  return;
}

Assistant:

VFunc(word valRight = 0) : Func<_n, Image>(WW<_m>(valRight)) {}